

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_driver.cc
# Opt level: O0

void test_93(QPDF *pdf,char *arg2)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  byte bVar2;
  bool bVar3;
  allocator<char> local_181;
  string local_180 [32];
  QPDFObjectHandle local_160;
  allocator<char> local_149;
  string local_148 [32];
  QPDFObjectHandle local_128;
  undefined1 local_118 [8];
  QPDFObjectHandle oh4;
  QPDFObjectHandle local_e8;
  allocator<char> local_d1;
  string local_d0 [32];
  undefined1 local_b0 [8];
  QPDFObjectHandle oh3;
  QPDFObjectHandle oh2;
  QPDFObjectHandle oh1;
  QPDFObjectHandle root2;
  allocator<char> local_59;
  string local_58 [32];
  undefined1 local_38 [8];
  QPDFObjectHandle root1;
  QPDFObjectHandle trailer;
  char *arg2_local;
  QPDF *pdf_local;
  
  QPDF::getTrailer();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_58,"/Root",&local_59);
  QPDFObjectHandle::getKey((string *)local_38);
  std::__cxx11::string::~string(local_58);
  std::allocator<char>::~allocator(&local_59);
  QPDF::getRoot();
  bVar2 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)local_38);
  if ((bVar2 & 1) == 0) {
    __assert_fail("root1.isSameObjectAs(root2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xcc8,"void test_93(QPDF &, const char *)");
  }
  operator____qpdf((char *)&oh2.super_BaseHandle.obj.
                            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                   0x176150);
  p_Var1 = &oh2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount;
  QPDFObjectHandle::QPDFObjectHandle
            ((QPDFObjectHandle *)
             &oh3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)p_Var1);
  bVar2 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)p_Var1);
  if ((bVar2 & 1) == 0) {
    __assert_fail("oh1.isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xccb,"void test_93(QPDF &, const char *)");
  }
  operator____qpdf(local_b0,0x176150);
  bVar2 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &oh2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!oh1.isSameObjectAs(oh3)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xccd,"void test_93(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_d0,"/One",&local_d1);
  operator____qpdf((char *)&local_e8,0x175a35);
  QPDFObjectHandle::replaceKey
            ((string *)
             &oh3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_d0);
  QPDFObjectHandle::~QPDFObjectHandle(&local_e8);
  std::__cxx11::string::~string(local_d0);
  std::allocator<char>::~allocator(&local_d1);
  bVar2 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &oh2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar2 & 1) == 0) {
    __assert_fail("oh1.isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xccf,"void test_93(QPDF &, const char *)");
  }
  QPDFObjectHandle::unparse_abi_cxx11_();
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &oh4.super_BaseHandle.obj.
                           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                          "<< /One /Three >>");
  if (!bVar3) {
    __assert_fail("oh2.unparse() == \"<< /One /Three >>\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd0,"void test_93(QPDF &, const char *)");
  }
  std::__cxx11::string::~string
            ((string *)
             &oh4.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  bVar2 = QPDFObjectHandle::isIndirect();
  if (((bVar2 ^ 0xff) & 1) == 0) {
    __assert_fail("!oh1.isIndirect()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd1,"void test_93(QPDF &, const char *)");
  }
  QPDFObjectHandle::QPDFObjectHandle
            (&local_128,
             (QPDFObjectHandle *)
             &oh2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDF::makeIndirectObject((QPDFObjectHandle *)local_118);
  QPDFObjectHandle::~QPDFObjectHandle(&local_128);
  bVar2 = QPDFObjectHandle::isSameObjectAs
                    ((QPDFObjectHandle *)
                     &oh2.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  if ((bVar2 & 1) == 0) {
    __assert_fail("oh1.isSameObjectAs(oh4)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd3,"void test_93(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isIndirect();
  if ((bVar2 & 1) == 0) {
    __assert_fail("oh1.isIndirect()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd4,"void test_93(QPDF &, const char *)");
  }
  bVar2 = QPDFObjectHandle::isIndirect();
  if ((bVar2 & 1) == 0) {
    __assert_fail("oh4.isIndirect()",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd5,"void test_93(QPDF &, const char *)");
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_148,"/Potato",&local_149);
  QPDFObjectHandle::replaceKey
            ((string *)
             &root1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(QPDFObjectHandle *)local_148);
  std::__cxx11::string::~string(local_148);
  std::allocator<char>::~allocator(&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>(local_180,"/Potato",&local_181);
  QPDFObjectHandle::getKey((string *)&local_160);
  bVar2 = QPDFObjectHandle::isSameObjectAs((QPDFObjectHandle *)&local_160);
  if ((bVar2 & 1) == 0) {
    __assert_fail("trailer.getKey(\"/Potato\").isSameObjectAs(oh2)",
                  "/workspace/llm4binary/github/license_c_cmakelists/qpdf[P]qpdf/qpdf/test_driver.cc"
                  ,0xcd7,"void test_93(QPDF &, const char *)");
  }
  QPDFObjectHandle::~QPDFObjectHandle(&local_160);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_118);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_b0);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &oh3.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &oh2.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &oh1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  QPDFObjectHandle::~QPDFObjectHandle((QPDFObjectHandle *)local_38);
  QPDFObjectHandle::~QPDFObjectHandle
            ((QPDFObjectHandle *)
             &root1.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return;
}

Assistant:

static void
test_93(QPDF& pdf, char const* arg2)
{
    // Test QPDFObjectHandle equality. Two QPDFObjectHandle objects
    // are equal if they point to the same underlying object.

    auto trailer = pdf.getTrailer();
    auto root1 = trailer.getKey("/Root");
    auto root2 = pdf.getRoot();
    assert(root1.isSameObjectAs(root2));
    auto oh1 = "<< /One /Two >>"_qpdf;
    auto oh2 = oh1;
    assert(oh1.isSameObjectAs(oh2));
    auto oh3 = "<< /One /Two >>"_qpdf;
    assert(!oh1.isSameObjectAs(oh3));
    oh2.replaceKey("/One", "/Three"_qpdf);
    assert(oh1.isSameObjectAs(oh2));
    assert(oh2.unparse() == "<< /One /Three >>");
    assert(!oh1.isIndirect());
    auto oh4 = pdf.makeIndirectObject(oh1);
    assert(oh1.isSameObjectAs(oh4));
    assert(oh1.isIndirect());
    assert(oh4.isIndirect());
    trailer.replaceKey("/Potato", oh1);
    assert(trailer.getKey("/Potato").isSameObjectAs(oh2));
}